

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::InputStream::skip(InputStream *this,size_t bytes)

{
  size_t in_RCX;
  void *__buf;
  byte scratch [8192];
  undefined1 auStack_2028 [8192];
  
  memset(auStack_2028,0,0x2000);
  for (; (void *)bytes != (void *)0x0; bytes = bytes - (long)__buf) {
    __buf = (void *)0x2000;
    if (bytes < (void *)0x2000) {
      __buf = (void *)bytes;
    }
    read(this,(int)auStack_2028,__buf,in_RCX);
  }
  return;
}

Assistant:

void InputStream::skip(size_t bytes) {
  byte scratch[8192]{};
  while (bytes > 0) {
    size_t amount = kj::min(bytes, sizeof(scratch));
    read(arrayPtr(scratch).first(amount));
    bytes -= amount;
  }
}